

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void eig(double *A,int N,double *eigre,double *eigim)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *H;
  int iVar5;
  long lVar6;
  long lVar7;
  int N_1;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined4 uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  lVar6 = (long)N;
  H = (double *)malloc(lVar6 * lVar6 * 8);
  iVar3 = N + -1;
  francis_iter(A,N,H);
  if (N < 2) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      if ((H[(iVar4 + 1) * N + iVar4] != 0.0) ||
         (iVar5 = iVar4 + 1, NAN(H[(iVar4 + 1) * N + iVar4]))) {
        pdVar1 = H + (long)(iVar4 * N) + (long)iVar4;
        dVar11 = *pdVar1;
        dVar9 = pdVar1[1];
        dVar8 = pdVar1[lVar6];
        dVar2 = pdVar1[lVar6 + 1];
        dVar10 = dVar9 + dVar8;
        dVar14 = 0.7071067811865475;
        dVar15 = 0.7071067811865475;
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          dVar14 = (dVar11 - dVar2) / dVar10;
          dVar14 = dVar14 / (SQRT(dVar14 * dVar14 + 1.0) + 1.0);
          dVar15 = 1.0 / SQRT(dVar14 * dVar14 + 1.0);
          dVar14 = dVar14 * dVar15;
        }
        dVar17 = dVar14 * dVar14;
        dVar16 = dVar15 * dVar15;
        dVar10 = dVar10 * dVar14 * dVar15;
        dVar14 = dVar14 * dVar15 * (dVar11 - dVar2);
        *pdVar1 = (dVar16 * dVar11 + dVar2 * dVar17) - dVar10;
        pdVar1[1] = (dVar16 * dVar9 - dVar8 * dVar17) + dVar14;
        pdVar1[lVar6] = (dVar16 * dVar8 - dVar9 * dVar17) + dVar14;
        pdVar1[lVar6 + 1] = dVar16 * dVar2 + dVar17 * dVar11 + dVar10;
        iVar5 = iVar4 + 2;
      }
      iVar4 = iVar5;
    } while (iVar4 < iVar3);
    if (N < 2) {
      iVar4 = 0;
    }
    else {
      iVar5 = 0;
      do {
        iVar4 = iVar5 + 1;
        lVar6 = (long)(iVar4 * N + iVar5);
        dVar11 = H[lVar6];
        lVar7 = (long)(iVar5 * (N + 1));
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          dVar9 = H[lVar7 + 1];
          if (0.0 <= dVar11 * dVar9) {
            dVar8 = 0.0;
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              dVar8 = dVar11 / dVar9;
              if (dVar8 < 0.0) {
                dVar8 = sqrt(dVar8);
              }
              else {
                dVar8 = SQRT(dVar8);
              }
              dVar8 = dVar8 / (dVar8 * dVar8 + 1.0);
            }
            uVar13 = 0;
            uVar12 = 0;
            dVar2 = H[lVar7];
            dVar8 = (dVar11 + dVar9) * dVar8;
            eigre[iVar5] = dVar2 - dVar8;
            eigre[iVar4] = dVar8 + dVar2;
            eigim[iVar5] = 0.0;
          }
          else {
            eigre[iVar5] = H[lVar7];
            eigre[iVar4] = H[lVar6 + 1];
            dVar11 = dVar11 * -dVar9;
            dVar9 = SQRT(dVar11);
            dVar8 = dVar9;
            if (dVar11 < 0.0) {
              dVar8 = sqrt(dVar11);
            }
            eigim[iVar5] = dVar8;
            if (dVar11 < 0.0) {
              dVar9 = sqrt(dVar11);
            }
            uVar13 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
            uVar12 = SUB84(dVar9,0);
          }
          eigim[iVar4] = (double)CONCAT44(uVar13,uVar12);
          iVar4 = iVar5 + 2;
        }
        else {
          eigre[iVar5] = H[lVar7];
          eigim[iVar5] = 0.0;
        }
        iVar5 = iVar4;
      } while (iVar4 < iVar3);
    }
  }
  if (iVar4 == iVar3) {
    eigre[iVar3] = H[(ulong)(uint)(N * N) - 1];
    eigim[iVar3] = 0.0;
  }
  free(H);
  return;
}

Assistant:

void eig(double *A,int N,double *eigre,double *eigim) {
	int i,t,u,n;
	double *H;
	double t1,t2,cs;
	H = (double*) malloc(sizeof(double) * N * N);
	n = N - 1;
	francis_iter(A,N,H);
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		if (H[t+i] != 0.) {
			eig2t(H+u+i,N);
			i = i +2;
		} else {
			i++;
		}
		
	}
	//mdisplay(H,N,N);
	i = 0;
	while (i < n) {
		u = i * N;
		t = (i+1)*N;
		
		if (H[t+i] != 0.) {
			if (H[u+i+1] * H[t+i] < 0.) {
				eigre[i] = H[u+i];
				eigre[i+1] = H[t+i+1];
				eigim[i] = sqrt(-H[u+i+1] * H[t+i]);
				eigim[i+1] = -sqrt(-H[u+i+1] * H[t+i]);
			} else {
				if (H[u+i+1] == 0.) {
					cs = 0.;
				} else {
					t1 = sqrt(H[t+i]/H[u+i+1]);
					t2 = t1 * t1;
					cs = t1/(1+t2);
				}
				eigre[i] = H[u+i] - cs * (H[u+i+1] + H[t+i]);
				eigre[i+1] = H[u+i] + cs * (H[u+i+1] + H[t+i]);
				eigim[i] = 0.;
				eigim[i+1] = 0.;
				
			}
			
			i= i + 2;
			
		} else {
			eigre[i] = H[u+i];
			eigim[i] = 0.;
			i++;
		}
		
	}
	
	if (i == n) {
		eigre[i] = H[N*N - 1];
		eigim[i] = 0.;
	}
	
	free(H);
}